

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<unsigned_long,void>::insert<unsigned_long&>
          (HighsHashTable<unsigned_long,_void> *this,unsigned_long *args)

{
  ulong uVar1;
  bool bVar2;
  pointer pHVar3;
  type puVar4;
  ulong uVar5;
  u64 uVar6;
  u64 uVar7;
  HighsHashTable<unsigned_long,_void> *in_RSI;
  HighsHashTable<unsigned_long,_void> *in_RDI;
  u64 distanceOfCurrentOccupant;
  u64 currentDistance;
  Entry *entryArray;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  Entry entry;
  size_t in_stack_ffffffffffffff88;
  HighsHashTable<unsigned_long,_void> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffc0;
  uchar in_stack_ffffffffffffffc7;
  u64 *in_stack_ffffffffffffffc8;
  HighsHashTable<unsigned_long,_void> *in_stack_ffffffffffffffd0;
  u64 *in_stack_ffffffffffffffd8;
  HighsHashTableEntry<unsigned_long,_void> in_stack_ffffffffffffffe0;
  bool local_1;
  
  HighsHashTableEntry<unsigned_long,_void>::HighsHashTableEntry<unsigned_long_&,_0>
            ((HighsHashTableEntry<unsigned_long,_void> *)&stack0xffffffffffffffe0,
             (unsigned_long *)in_RSI);
  HighsHashTableEntry<unsigned_long,_void>::key
            ((HighsHashTableEntry<unsigned_long,_void> *)&stack0xffffffffffffffe0);
  bVar2 = HighsHashTable<unsigned_long,_void>::findPosition
                    (in_RSI,(KeyType *)in_stack_ffffffffffffffe0.value_,
                     (u8 *)in_stack_ffffffffffffffd8,(u64 *)in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8,
                     (u64 *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (bVar2) {
    local_1 = false;
  }
  else if ((in_RDI->numElements == (in_RDI->tableSizeMask + 1) * 7 >> 3) ||
          (in_stack_ffffffffffffffd8 == in_stack_ffffffffffffffc8)) {
    HighsHashTable<unsigned_long,_void>::growTable(in_stack_ffffffffffffffd0);
    local_1 = insert<HighsHashTableEntry<unsigned_long,void>>
                        (in_RSI,(HighsHashTableEntry<unsigned_long,_void> *)
                                in_stack_ffffffffffffffe0.value_);
  }
  else {
    pHVar3 = std::
             unique_ptr<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
             ::get(&in_stack_ffffffffffffff90->entries);
    in_RDI->numElements = in_RDI->numElements + 1;
    do {
      puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      bVar2 = HighsHashTable<unsigned_long,_void>::occupied(in_RDI,*puVar4);
      if (!bVar2) {
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        *puVar4 = in_stack_ffffffffffffffc7;
        pHVar3[(long)in_stack_ffffffffffffffd8].value_ = in_stack_ffffffffffffffe0.value_;
        return true;
      }
      uVar5 = (long)in_stack_ffffffffffffffd8 - (long)in_stack_ffffffffffffffd0;
      uVar1 = in_RDI->tableSizeMask;
      uVar6 = HighsHashTable<unsigned_long,_void>::distanceFromIdealSlot
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (uVar6 < (uVar5 & uVar1)) {
        std::swap<HighsHashTableEntry<unsigned_long,void>>
                  ((HighsHashTableEntry<unsigned_long,_void> *)&stack0xffffffffffffffe0,
                   pHVar3 + (long)in_stack_ffffffffffffffd8);
        puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::swap<unsigned_char>(&stack0xffffffffffffffc7,puVar4);
        in_stack_ffffffffffffff90 =
             (HighsHashTable<unsigned_long,_void> *)
             ((long)in_stack_ffffffffffffffd8 - uVar6 & in_RDI->tableSizeMask);
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffff90;
        uVar7 = HighsHashTable<unsigned_long,_void>::maxDistance();
        in_stack_ffffffffffffffc8 =
             (u64 *)((long)&(in_stack_ffffffffffffff90->entries)._M_t.
                            super___uniq_ptr_impl<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
                            .
                            super__Head_base<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_false>
                            ._M_head_impl + uVar7 & in_RDI->tableSizeMask);
      }
      in_stack_ffffffffffffffd8 =
           (u64 *)((long)in_stack_ffffffffffffffd8 + 1U & in_RDI->tableSizeMask);
    } while (in_stack_ffffffffffffffd8 != in_stack_ffffffffffffffc8);
    HighsHashTable<unsigned_long,_void>::growTable(in_stack_ffffffffffffffd0);
    insert<HighsHashTableEntry<unsigned_long,void>>
              (in_RSI,(HighsHashTableEntry<unsigned_long,_void> *)in_stack_ffffffffffffffe0.value_);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }